

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3InsertDocsize(int *pRC,Fts3Table *p,u32 *aSz)

{
  long lVar1;
  int iVar2;
  u32 *a;
  sqlite3_stmt *in_RDX;
  sqlite3_value **in_RSI;
  sqlite3_stmt **in_RDI;
  long in_FS_OFFSET;
  int rc;
  char *pBlob;
  sqlite3_stmt *pStmt;
  int nBlob;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  int i;
  sqlite3_stmt *pStmt_00;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xaaaaaaaa;
  pStmt_00 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
  uVar3 = 0xaaaaaaaa;
  if (*(int *)in_RDI == 0) {
    a = (u32 *)sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (a == (u32 *)0x0) {
      *(int *)in_RDI = 7;
    }
    else {
      fts3EncodeIntArray((int)((ulong)in_RDX >> 0x20),a,
                         (char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                         (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      i = (int)((ulong)a >> 0x20);
      iVar2 = fts3SqlStmt((Fts3Table *)CONCAT44(uVar4,in_stack_fffffffffffffff0),
                          (int)((ulong)pStmt_00 >> 0x20),in_RDI,in_RSI);
      if (iVar2 == 0) {
        sqlite3_bind_int64(in_RDX,i,(ulong)in_stack_ffffffffffffffc0);
        sqlite3_bind_blob(in_RDX,i,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc,(_func_void_void_ptr *)0x25456d);
        sqlite3_step(pStmt_00);
        iVar2 = sqlite3_reset(in_RDX);
        *(int *)in_RDI = iVar2;
      }
      else {
        sqlite3_free((void *)0x254526);
        *(int *)in_RDI = iVar2;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3InsertDocsize(
  int *pRC,                       /* Result code */
  Fts3Table *p,                   /* Table into which to insert */
  u32 *aSz                        /* Sizes of each column, in tokens */
){
  char *pBlob;             /* The BLOB encoding of the document size */
  int nBlob;               /* Number of bytes in the BLOB */
  sqlite3_stmt *pStmt;     /* Statement used to insert the encoding */
  int rc;                  /* Result code from subfunctions */

  if( *pRC ) return;
  pBlob = sqlite3_malloc64( 10*(sqlite3_int64)p->nColumn );
  if( pBlob==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  fts3EncodeIntArray(p->nColumn, aSz, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_DOCSIZE, &pStmt, 0);
  if( rc ){
    sqlite3_free(pBlob);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int64(pStmt, 1, p->iPrevDocid);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, sqlite3_free);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
}